

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_param_tests1.cpp
# Opt level: O1

void __thiscall
type_param_test::iutest_typed_test_suite_p_name_RegisterVerboseSpaceTypeParamTest_::B<int>::Body
          (B<int> *this)

{
  AssertionResult iutest_ar;
  type **in_stack_fffffffffffffe08;
  allocator<char> local_1e9;
  AssertionResult local_1e8;
  AssertionHelper local_1c0;
  undefined1 local_190 [392];
  
  iutest::UnitTest::instance();
  iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
            (&local_1e8,(internal *)"\"B\"",
             "::iutest::UnitTest::GetInstance()->current_test_info()->name()","B",
             (iutest::Test::Observer<void>::s_current->m_test_info->m_test_info->m_testname).
             _M_dataplus._M_p,(char *)&iutest_type_traits::enabler_t<void>::value,
             in_stack_fffffffffffffe08);
  if (local_1e8.m_result == false) {
    memset((iu_global_format_stringstream *)local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,local_1e8.m_message._M_dataplus._M_p,&local_1e9);
    local_1c0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/type_param_tests1.cpp"
    ;
    local_1c0.m_part_result.super_iuCodeMessage.m_line = 0x46;
    local_1c0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1c0,(Fixed *)local_190,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1c0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1c0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1c0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.m_message._M_dataplus._M_p != &local_1e8.m_message.field_2) {
    operator_delete(local_1e8.m_message._M_dataplus._M_p,
                    local_1e8.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST_P(VerifyFailTypeParamTest, A)
{
}